

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O1

bool __thiscall pegmatite::CharacterExpr::parse_non_term(CharacterExpr *this,Context *con)

{
  Index *pIVar1;
  int *piVar2;
  char32_t cVar3;
  Index IVar4;
  int iVar5;
  char32_t cVar6;
  
  if ((((con->position).it.buffer != (con->finish).buffer) ||
      ((con->position).it.idx != (con->finish).idx)) &&
     (cVar3 = this->character, cVar6 = Context::symbol(con), cVar6 == cVar3)) {
    pIVar1 = &(con->position).it.idx;
    *pIVar1 = *pIVar1 + 1;
    piVar2 = &(con->position).col;
    *piVar2 = *piVar2 + 1;
    return true;
  }
  if ((con->error_pos).it.idx < (con->position).it.idx) {
    iVar5 = (con->position).col;
    (con->error_pos).line = (con->position).line;
    (con->error_pos).col = iVar5;
    IVar4 = (con->position).it.idx;
    (con->error_pos).it.buffer = (con->position).it.buffer;
    (con->error_pos).it.idx = IVar4;
  }
  return false;
}

Assistant:

bool CharacterExpr::parse_non_term(Context &con) const
{
	return parseCharacter(con, character);
}